

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableauPileColliderTests.cpp
# Opt level: O2

void __thiscall
solitaire::colliders::TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test::
~TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test
          (TableauPileColliderCollidedCardTests_getCollidedCardIndex_Test *this)

{
  TableauPileColliderTests::~TableauPileColliderTests
            ((TableauPileColliderTests *)
             &this[-1].super_TableauPileColliderCollidedCardTests.super_TableauPileColliderTests.
              super_Test.gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(TableauPileColliderCollidedCardTests, getCollidedCardIndex) {
    const auto& collidedCardData = GetParam();
    Cards cards {collidedCardData.cardsQuantity};

    EXPECT_CALL(tableauPileMock, getCards()).WillRepeatedly(ReturnRef(cards));
    EXPECT_CALL(tableauPileMock, getTopCoveredCardPosition())
        .WillRepeatedly(Return(collidedCardData.topCoveredCardPosition));

    EXPECT_EQ(
        collider.tryGetCollidedCardIndex(collidedCardData.collidedPosition),
        collidedCardData.cardIndex
    );
}